

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O1

void __thiscall google::NullStream::~NullStream(NullStream *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_LogStream).super_ostream._vptr_basic_ostream[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_LogStream).super_ostream._vptr_basic_ostream + (long)p_Var2);
  *(undefined8 *)p_Var1 = 0x12e548;
  *(undefined8 *)(p_Var1 + 0x60) = 0x12e570;
  *(code **)(p_Var1 + 8) = __assert_fail;
  std::locale::~locale((locale *)(&(this->super_LogStream).super_ostream.field_0x40 + (long)p_Var2))
  ;
  std::ios_base::~ios_base((ios_base *)(p_Var1 + 0x60));
  operator_delete((_func_int *)
                  ((long)&(this->super_LogStream).super_ostream._vptr_basic_ostream + (long)p_Var2),
                  0x168);
  return;
}

Assistant:

class GLOG_EXPORT NullStream : public LogMessage::LogStream {
 public:
  // Initialize the LogStream so the messages can be written somewhere
  // (they'll never be actually displayed). This will be needed if a
  // NullStream& is implicitly converted to LogStream&, in which case
  // the overloaded NullStream::operator<< will not be invoked.
  NullStream();
  NullStream(const char* /*file*/, int /*line*/,
             const CheckOpString& /*result*/);
  NullStream& stream();

 private:
  // A very short buffer for messages (which we discard anyway). This
  // will be needed if NullStream& converted to LogStream& (e.g. as a
  // result of a conditional expression).
  char message_buffer_[3];
}